

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O2

psa_status_t
psa_validate_persistent_key_parameters
          (psa_key_lifetime_t lifetime,psa_key_file_id_t id,psa_se_drv_table_entry_t **p_drv,
          int creating)

{
  psa_status_t pVar1;
  
  if (p_drv != (psa_se_drv_table_entry_t **)0x0) {
    *p_drv = (psa_se_drv_table_entry_t *)0x0;
  }
  pVar1 = -0x87;
  if (lifetime == 1) {
    if (creating != 0) {
      creating = -0x87;
    }
    if ((int)id < 0x40000000) {
      creating = -0x87;
    }
    pVar1 = 0;
    if (id + 0xc0000000 < 0xc0000001) {
      pVar1 = creating;
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_validate_persistent_key_parameters(
    psa_key_lifetime_t lifetime,
    psa_key_file_id_t id,
    psa_se_drv_table_entry_t **p_drv,
    int creating )
{
    if( p_drv != NULL )
        *p_drv = NULL;
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_key_lifetime_is_external( lifetime ) )
    {
        *p_drv = psa_get_se_driver_entry( lifetime );
        if( *p_drv == NULL )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    if( lifetime != PSA_KEY_LIFETIME_PERSISTENT )
        return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    if( ! psa_is_key_id_valid( id, ! creating ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    return( PSA_SUCCESS );

#else /* MBEDTLS_PSA_CRYPTO_STORAGE_C */
    (void) id;
    (void) creating;
    return( PSA_ERROR_NOT_SUPPORTED );
#endif /* !MBEDTLS_PSA_CRYPTO_STORAGE_C */
}